

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O2

uint256 * __thiscall CPubKey::GetHash(uint256 *__return_storage_ptr__,CPubKey *this)

{
  byte bVar1;
  long in_FS_OFFSET;
  Span<const_unsigned_char> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->vch[0] & 0xfe) == 2) {
    local_20.m_size = 0x21;
  }
  else {
    bVar1 = this->vch[0] - 4;
    if (bVar1 < 4) {
      local_20.m_size = *(size_t *)(&DAT_006d3710 + (ulong)bVar1 * 8);
    }
    else {
      local_20.m_size = 0;
    }
  }
  local_20.m_data = this->vch;
  Hash<Span<unsigned_char_const>>(__return_storage_ptr__,&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

uint256 GetHash() const
    {
        return Hash(Span{vch}.first(size()));
    }